

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.h
# Opt level: O2

void QDir::current(void)

{
  QDir *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QDir::currentPath();
  QDir::QDir(in_RDI,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline QDir current() { return QDir(currentPath()); }